

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void on_request(http_s *request)

{
  int iVar1;
  char *data;
  uintptr_t uStack_30;
  fio_str_info_s fStack_28;
  
  fiobj_obj2cstr(&fStack_28,request->method);
  iVar1 = strcmp("POST",fStack_28.data);
  if (iVar1 == 0) {
    iVar1 = request_contains_shutdown_token(request);
    if (iVar1 != 0) {
      http_send_body(request,"{\"status\": 0}\r\n",0xf);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x47,"Shutting down!");
      system("sudo shutdown -h now");
      return;
    }
    data = "{\"status\": -1}\r\n";
    uStack_30 = 0x10;
  }
  else {
    data = "{\"status\": 1}\r\n";
    uStack_30 = 0xf;
  }
  http_send_body(request,data,uStack_30);
  return;
}

Assistant:

void on_request(http_s *request) {
  /* honour non-POST requests with HTTP 200 */
  if (strcmp("POST", fiobj_obj2cstr(request->method).data)) {
    http_send_body(request, "{\"status\": 1}\r\n", 15);
    return;
  }

  /* shutdown only if body is JSON object {"token": "<RSHUTDOWN_TOKEN_ENV_VAR>"} */
  if (request_contains_shutdown_token(request)) {
      http_send_body(request, "{\"status\": 0}\r\n", 15);
#ifdef NO_SHUTDOWN
      log_info("NO_SHUTDOWN set - not shutting down");
#else
      log_info("Shutting down!");
      system("sudo shutdown -h now");
#endif
  }
  else {
      http_send_body(request, "{\"status\": -1}\r\n", 16);
  }
}